

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

int lj_cconv_multi_init(CTState *cts,CType *d,TValue *o)

{
  uint32_t uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = d->info & 0xf0000000;
  iVar3 = 0;
  if (((d->info & 0xfc000000) == 0x30000000 || uVar4 == 0x10000000) &&
     (uVar1 = (o->field_2).it, uVar1 != 0xfffffff4)) {
    if (uVar1 == 0xfffffff5) {
      uVar2 = (ulong)*(ushort *)((ulong)(o->u32).lo + 6);
      do {
        uVar5 = uVar2;
        uVar4 = cts->tab[uVar5].info;
        uVar2 = (ulong)(uVar4 & 0xffff);
      } while ((uVar4 & 0xf0800000) == 0x20800000);
      if (cts->tab + uVar5 == d) {
        return 0;
      }
    }
    else if ((uVar1 == 0xfffffffb) && (uVar4 != 0x10000000)) {
      return 0;
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int lj_cconv_multi_init(CTState *cts, CType *d, TValue *o)
{
  if (!(ctype_isrefarray(d->info) || ctype_isstruct(d->info)))
    return 0;  /* Destination is not an aggregate. */
  if (tvistab(o) || (tvisstr(o) && !ctype_isstruct(d->info)))
    return 0;  /* Initializer is not a value. */
  if (tviscdata(o) && lj_ctype_rawref(cts, cdataV(o)->ctypeid) == d)
    return 0;  /* Source and destination are identical aggregates. */
  return 1;  /* Otherwise the initializer is a value. */
}